

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RC4.cc
# Opt level: O0

void __thiscall Pl_RC4::finish(Pl_RC4 *this)

{
  Pipeline *pPVar1;
  shared_ptr<unsigned_char> local_20;
  Pl_RC4 *local_10;
  Pl_RC4 *this_local;
  
  local_10 = this;
  std::shared_ptr<unsigned_char>::shared_ptr(&local_20,(nullptr_t)0x0);
  std::shared_ptr<unsigned_char>::operator=(&this->outbuf,&local_20);
  std::shared_ptr<unsigned_char>::~shared_ptr(&local_20);
  pPVar1 = Pipeline::next(&this->super_Pipeline);
  (*pPVar1->_vptr_Pipeline[3])();
  return;
}

Assistant:

void
Pl_RC4::finish()
{
    outbuf = nullptr;
    next()->finish();
}